

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float *pfVar1;
  uint in_ESI;
  long in_RDI;
  ImRect IVar2;
  float scrollbar_size;
  float border_size;
  ImRect inner_rect;
  ImRect outer_rect;
  float y2;
  undefined8 uVar3;
  float x1;
  undefined4 uVar4;
  float lhs;
  undefined4 uStack_28;
  undefined4 local_24;
  undefined4 uStack_20;
  undefined1 local_10 [16];
  
  IVar2 = ImGuiWindow::Rect((ImGuiWindow *)0x19b9a7);
  lhs = IVar2.Min.x;
  uStack_28 = IVar2.Min.y;
  local_24 = IVar2.Max.x;
  uStack_20 = IVar2.Max.y;
  uVar3 = *(undefined8 *)(in_RDI + 0x1d0);
  x1 = (float)*(undefined8 *)(in_RDI + 0x1d8);
  uVar4 = (undefined4)((ulong)*(undefined8 *)(in_RDI + 0x1d8) >> 0x20);
  y2 = *(float *)(in_RDI + 0x4c);
  pfVar1 = ImVec2::operator[]((ImVec2 *)(in_RDI + 0x84),(long)(int)(in_ESI ^ 1));
  if (in_ESI == 0) {
    ImMax<float>(uStack_28,(uStack_20 - y2) - *pfVar1);
    ImRect::ImRect((ImRect *)CONCAT44(lhs,uVar4),x1,(float)((ulong)uVar3 >> 0x20),(float)uVar3,y2);
  }
  else {
    ImMax<float>(lhs,(local_24 - y2) - *pfVar1);
    ImRect::ImRect((ImRect *)CONCAT44(lhs,uVar4),x1,(float)((ulong)uVar3 >> 0x20),(float)uVar3,y2);
  }
  return (ImRect)local_10;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}